

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,ModuleInstantiationStmt *stmt)

{
  undefined1 *puVar1;
  size_t *__rhs;
  Param *pPVar2;
  bool bVar3;
  __node_base _Var4;
  pointer pbVar5;
  __type_conflict2 _Var6;
  int iVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  mapped_type *ppPVar10;
  undefined4 extraout_var;
  Generator *pGVar12;
  VarException *this_00;
  _Rb_tree_node_base *p_Var13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  char cVar14;
  undefined1 __k [8];
  char cVar15;
  pointer pcVar16;
  size_type *psVar17;
  SystemVerilogCodeGen *this_01;
  string_view sVar18;
  basic_string_view<char> bVar19;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  initializer_list<const_kratos::IRNode_*> __l;
  undefined1 local_238 [8];
  map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  debug_info;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>_>
  params_;
  string value;
  undefined1 auStack_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_names;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_98;
  pointer local_78;
  size_type sStack_70;
  _Rb_tree_node_base *local_60;
  ostream *local_58;
  ModuleInstantiationStmt *local_50;
  allocator_type local_42;
  allocator<char> local_41;
  SystemVerilogCodeGen *local_40;
  _Hash_node_base *local_38;
  Generator *pGVar11;
  
  local_40 = this;
  if ((stmt->super_Stmt).super_IRNode.comment._M_string_length != 0) {
    sVar18 = indent(this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar18._M_str,
                        sVar18._M_len);
    poVar8 = std::operator<<(poVar8,"// ");
    strip_newline((string *)local_128,&(stmt->super_Stmt).super_IRNode.comment);
    this = local_40;
    poVar8 = std::operator<<(poVar8,(string *)local_128);
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    std::operator<<(poVar8,'\n');
    std::__cxx11::string::~string((string *)local_128);
  }
  (stmt->super_Stmt).super_IRNode.verilog_ln =
       *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  sVar18 = indent(this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar18._M_str,sVar18._M_len);
  std::operator<<(poVar8,(string *)&stmt->target_->name);
  pGVar11 = stmt->target_;
  local_50 = stmt;
  std::
  _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  ::_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
              *)local_238,&(stmt->super_InstantiationStmt).port_debug_._M_t);
  local_128 = (undefined1  [8])&params_._M_h._M_rehash_policy._M_next_resize;
  params_._M_h._M_buckets = (__buckets_ptr)0x1;
  psVar17 = &params_._M_h._M_bucket_count;
  params_._M_h._M_bucket_count = 0;
  params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  params_._M_h._M_element_count._0_4_ = 0x3f800000;
  params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  params_._M_h._M_rehash_policy._4_4_ = 0;
  params_._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var9 = (pGVar11->params_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(pGVar11->params_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_60 = p_Var13;
  local_58 = (ostream *)puVar1;
  do {
    poVar8 = local_58;
    if (p_Var9 == p_Var13) {
      if (params_._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
        std::operator<<(local_58," ");
        this_01 = local_40;
      }
      else {
        auStack_b8 = (undefined1  [8])0x0;
        param_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        param_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_b8,(size_type)params_._M_h._M_before_begin._M_nxt);
        while (psVar17 = (size_type *)*psVar17, psVar17 != (size_type *)0x0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_b8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar17 + 1));
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (auStack_b8,
                   param_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        poVar8 = std::operator<<(local_58," #(");
        puVar1 = &(local_40->stream_).super_stringstream.field_0x90;
        *(long *)puVar1 = *(long *)puVar1 + 1;
        std::operator<<(poVar8,'\n');
        pbVar5 = param_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_40->indent_ = local_40->indent_ + 1;
        local_60 = (_Rb_tree_node_base *)CONCAT44(local_60._4_4_,1);
        this_01 = local_40;
        for (__k = auStack_b8; poVar8 = local_58, __k != (undefined1  [8])pbVar5;
            __k = (undefined1  [8])((long)__k + 0x20)) {
          ppPVar10 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_128,(key_type *)__k);
          Param::value_str_abi_cxx11_((string *)&params_._M_h._M_single_bucket,*ppPVar10);
          pPVar2 = (*ppPVar10)->parent_param_;
          if (pPVar2 != (Param *)0x0) {
            iVar7 = (*(pPVar2->super_Const).super_Var.super_IRNode._vptr_IRNode[0xd])(pPVar2);
            pGVar11 = (Generator *)CONCAT44(extraout_var,iVar7);
            pGVar12 = Stmt::generator_parent(&local_50->super_Stmt);
            if (pGVar11 != pGVar12) {
              this_00 = (VarException *)__cxa_allocate_exception(0x10);
              pGVar12 = Stmt::generator_parent(&local_50->super_Stmt);
              local_98._M_value._M_dataplus._M_p = (_Alloc_hider)(pGVar11->name)._M_dataplus._M_p;
              local_98._M_value._M_string_length = (pGVar11->name)._M_string_length;
              local_98._16_8_ = (pPVar2->super_Const).super_Var.name._M_dataplus._M_p;
              local_98._24_8_ = (pPVar2->super_Const).super_Var.name._M_string_length;
              local_78 = (pGVar12->name)._M_dataplus._M_p;
              sStack_70 = (pGVar12->name)._M_string_length;
              bVar19 = fmt::v7::to_string_view<char,_0>("{0}.{1} is not declared in generator {2}");
              format_str_00.data_ = (char *)bVar19.size_;
              args_00.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = in_R9.args_;
              args_00.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)&local_98;
              format_str_00.size_ = 0xddd;
              fmt::v7::detail::vformat_abi_cxx11_
                        ((string *)&local_170,(detail *)bVar19.data_,format_str_00,args_00);
              local_148._M_dataplus._M_p = (pointer)local_50;
              __l._M_len = 3;
              __l._M_array = (iterator)&local_148;
              local_148._M_string_length = (size_type)pGVar11;
              local_148.field_2._M_allocated_capacity = (size_type)pPVar2;
              std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                        ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                         &local_98._M_value,__l,&local_42);
              VarException::VarException
                        (this_00,(string *)&local_170,
                         (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                         &local_98._M_value);
              __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          sVar18 = indent(this_01);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_58,sVar18._M_str,sVar18._M_len);
          _Var4 = params_._M_h._M_before_begin;
          local_38 = (_Hash_node_base *)((ulong)local_60 & 0xffffffff);
          if (params_._M_h._M_before_begin._M_nxt == local_38) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,")",&local_41);
          }
          else {
            puVar1 = &(local_40->stream_).super_stringstream.field_0x90;
            *(long *)puVar1 = *(long *)puVar1 + 1;
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_190,'\x01');
            std::operator+(&local_148,",",&local_190);
          }
          local_98._M_value._M_dataplus._M_p = (_Alloc_hider)(((key_type *)__k)->_M_dataplus)._M_p;
          local_98._M_value._M_string_length = ((key_type *)__k)->_M_string_length;
          local_98._16_8_ = params_._M_h._M_single_bucket;
          local_78 = local_148._M_dataplus._M_p;
          sStack_70 = local_148._M_string_length;
          bVar19 = fmt::v7::to_string_view<char,_0>(".{0}({1}){2}");
          format_str.data_ = (char *)bVar19.size_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_98;
          format_str.size_ = 0xddd;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)&local_170,(detail *)bVar19.data_,format_str,args);
          std::operator<<(poVar8,(string *)&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_148);
          if (_Var4._M_nxt != local_38) {
            std::__cxx11::string::~string((string *)&local_190);
          }
          this_01 = local_40;
          std::__cxx11::string::~string((string *)&params_._M_h._M_single_bucket);
          local_60 = (_Rb_tree_node_base *)CONCAT44(local_60._4_4_,(int)local_60 + 1);
        }
        puVar1 = &(this_01->stream_).super_stringstream.field_0x90;
        *(long *)puVar1 = *(long *)puVar1 + 1;
        std::operator<<(local_58,'\n');
        this_01->indent_ = this_01->indent_ - 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_b8);
      }
      std::operator<<(poVar8,(string *)&local_50->target_->instance_name);
      generate_port_interface(this_01,&stmt->super_InstantiationStmt);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_128);
      std::
      _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
      ::~_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                   *)local_238);
      return;
    }
    pcVar16 = *(pointer *)(p_Var9 + 2);
    if (((*(long *)(pcVar16 + 0x368) != 0) || ((pcVar16[0x380] & 1U) == 0)) ||
       (*(long *)(pcVar16 + 0x378) != *(long *)(pcVar16 + 0x270))) {
      if (*(int *)(pcVar16 + 0x2c0) == 3) {
        std::
        _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          *)&local_98._M_value,
                         (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          *)(pcVar16 + 0x388));
        cVar15 = (char)local_78;
        if (((char)local_78 == '\x01') &&
           (std::
            _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              *)&local_1e0,
                             (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              *)(*(long *)(p_Var9 + 2) + 0x3b0)), local_1e0._M_engaged == true)) {
          std::
          _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            *)&local_1b8,
                           (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            *)(*(long *)(p_Var9 + 2) + 0x388));
          __rhs = &debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::
          _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            *)__rhs,(_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                     *)(*(long *)(p_Var9 + 2) + 0x3b0));
          _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_1b8,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs);
          bVar3 = true;
          cVar14 = '\x01';
          if (!_Var6) goto LAB_0018acc7;
LAB_0018ad2f:
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_1b8);
        }
        else {
          bVar3 = false;
LAB_0018acc7:
          std::
          _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            *)&params_._M_h._M_single_bucket,
                           (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            *)(*(long *)(p_Var9 + 2) + 0x388));
          if (value.field_2._M_local_buf[8] == '\0') {
            local_38 = (_Hash_node_base *)CONCAT71(local_38._1_7_,cVar15);
            std::
            _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              *)&local_170,
                             (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              *)(*(long *)(p_Var9 + 2) + 0x3b0));
            cVar14 = local_170._M_engaged;
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset(&local_170);
            cVar15 = (char)local_38;
          }
          else {
            cVar14 = '\0';
          }
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&params_._M_h._M_single_bucket);
          if (bVar3) goto LAB_0018ad2f;
        }
        if (cVar15 != '\0') {
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_1e0);
        }
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98._M_value);
        p_Var13 = local_60;
        if (cVar14 != '\0') goto LAB_0018ad9f;
        pcVar16 = *(pointer *)(p_Var9 + 2);
      }
      std::__cxx11::string::string((string *)&local_98._M_value,(string *)(p_Var9 + 1));
      local_78 = pcVar16;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Param*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Param*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,kratos::Param*>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Param*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Param*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_128,&local_98);
      std::__cxx11::string::~string((string *)&local_98._M_value);
    }
LAB_0018ad9f:
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
  } while( true );
}

Assistant:

void SystemVerilogCodeGen::stmt_code(ModuleInstantiationStmt* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    stmt->verilog_ln = stream_.line_no();
    stream_ << indent() << stmt->target()->name;
    const auto& params = stmt->target()->get_params();
    auto debug_info = stmt->port_debug();

    // pre-filter the parameters if the initial value is the same as the current value
    std::unordered_map<std::string, Param*> params_;
    for (auto const& [name, param] : params) {
        if (!param->parent_param() && param->get_initial_value() &&
            (*param->get_initial_value()) == param->value()) {
            continue;
        }
        // could be raw string type as well
        if (param->param_type() == ParamType::RawType &&
            ((param->get_raw_str_value() && param->get_raw_str_initial_value() &&
              (*param->get_raw_str_value()) == (*param->get_raw_str_initial_value())) ||
             (!param->get_raw_str_value() && param->get_raw_str_initial_value()))) {
            continue;
        }
        params_.emplace(std::make_pair(name, param.get()));
    }

    if (!params_.empty()) {
        std::vector<std::string> param_names;
        param_names.reserve(params_.size());
        for (auto const& iter : params_) {
            param_names.emplace_back(iter.first);
        }
        std::sort(param_names.begin(), param_names.end());
        stream_ << " #(" << stream_.endl();
        indent_++;

        uint32_t count = 0;
        for (auto const& name : param_names) {
            auto const& param = params_.at(name);
            auto value = param->value_str();
            if (param->parent_param()) {
                const auto* p = param->parent_param();
                // checking on parameter parent
                auto* p_gen = p->generator();
                if (p_gen != stmt->generator_parent()) {
                    throw VarException(
                        ::format("{0}.{1} is not declared in generator {2}", p_gen->name, p->name,
                                 stmt->generator_parent()->name),
                        {stmt, p_gen, p});
                }
            }
            stream_ << indent()
                    << ::format(
                           ".{0}({1}){2}", name, value,
                           ++count == params_.size() ? ")" : "," + std::string(1, stream_.endl()));
        }

        // start a new line
        stream_ << stream_.endl();
        indent_--;
    } else {
        stream_ << " ";
    }
    stream_ << stmt->target()->instance_name;
    generate_port_interface(stmt);
}